

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialogPrivate::writingSystemHighlighted(QFontDialogPrivate *this,int index)

{
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QFontDialogPrivate *in_stack_00000038;
  QString *text;
  QLineEdit *this_00;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(in_RDI + 0x3a8) = in_ESI;
  text = *(QString **)(in_RDI + 0x350);
  this_00 = (QLineEdit *)&stack0xffffffffffffffe0;
  QFontDatabase::writingSystemSample((WritingSystem)this_00);
  QLineEdit::setText(this_00,text);
  QString::~QString((QString *)0x793a8b);
  updateFamilies(in_stack_00000038);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::writingSystemHighlighted(int index)
{
    writingSystem = QFontDatabase::WritingSystem(index);
    sampleEdit->setText(QFontDatabase::writingSystemSample(writingSystem));
    updateFamilies();
}